

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

size_t cm_strverscmp_count_leading_zeros(char *s,size_t b)

{
  size_t sVar1;
  uint uVar2;
  size_t i;
  size_t sVar3;
  
  uVar2 = (uint)(byte)s[b];
  sVar3 = 0;
  do {
    sVar1 = sVar3;
    if ((char)uVar2 != '0') {
      return sVar1;
    }
    uVar2 = (uint)(s + b)[sVar3 + 1];
    sVar3 = sVar3 + 1;
  } while (uVar2 - 0x30 < 10);
  return sVar1;
}

Assistant:

static size_t cm_strverscmp_count_leading_zeros(const char* s, size_t b)
{
  size_t i = b;
  /* Step forward over zeros that are followed by another digit.  */
  while (s[i] == '0' && isdigit(s[i + 1])) {
    ++i;
  }
  return i - b;
}